

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

bool boost::filesystem::detail::equivalent(path *p1,path *p2,error_code *ec)

{
  int iVar1;
  value_type *pvVar2;
  bool local_156;
  bool local_155;
  undefined1 auStack_150 [4];
  int e1;
  stat s1;
  undefined1 auStack_b8 [4];
  int e2;
  stat s2;
  error_code *ec_local;
  path *p2_local;
  path *p1_local;
  
  s2.__glibc_reserved[2] = (__syscall_slong_t)ec;
  pvVar2 = filesystem::path::c_str(p2);
  s1.__glibc_reserved[2]._4_4_ = stat64(pvVar2,(stat64 *)auStack_b8);
  pvVar2 = filesystem::path::c_str(p1);
  iVar1 = stat64(pvVar2,(stat64 *)auStack_150);
  if ((iVar1 == 0) && (s1.__glibc_reserved[2]._4_4_ == 0)) {
    local_156 = false;
    if (((_auStack_150 == _auStack_b8) && (local_156 = false, s1.st_dev == s2.st_dev)) &&
       (local_156 = false, s1.st_rdev == s2.st_rdev)) {
      local_156 = s1.st_atim.tv_nsec == s2.st_atim.tv_nsec;
    }
    p1_local._7_1_ = local_156;
  }
  else {
    local_155 = iVar1 != 0 && s1.__glibc_reserved[2]._4_4_ != 0;
    anon_unknown.dwarf_522f::error
              ((uint)local_155,p1,p2,(error_code *)s2.__glibc_reserved[2],
               "boost::filesystem::equivalent");
    p1_local._7_1_ = false;
  }
  return p1_local._7_1_;
}

Assistant:

BOOST_FILESYSTEM_DECL
  bool equivalent(const path& p1, const path& p2, system::error_code* ec)
  {
#   ifdef BOOST_POSIX_API
    struct stat s2;
    int e2(::stat(p2.c_str(), &s2));
    struct stat s1;
    int e1(::stat(p1.c_str(), &s1));

    if (e1 != 0 || e2 != 0)
    {
      // if one is invalid and the other isn't then they aren't equivalent,
      // but if both are invalid then it is an error
      error (e1 != 0 && e2 != 0, p1, p2, ec, "boost::filesystem::equivalent");
      return false;
    }

    // both stats now known to be valid
    return  s1.st_dev == s2.st_dev && s1.st_ino == s2.st_ino
        // According to the POSIX stat specs, "The st_ino and st_dev fields
        // taken together uniquely identify the file within the system."
        // Just to be sure, size and mod time are also checked.
        && s1.st_size == s2.st_size && s1.st_mtime == s2.st_mtime;

#   else  // Windows

    // Note well: Physical location on external media is part of the
    // equivalence criteria. If there are no open handles, physical location
    // can change due to defragmentation or other relocations. Thus handles
    // must be held open until location information for both paths has
    // been retrieved.

    // p2 is done first, so any error reported is for p1
    handle_wrapper h2(
      create_file_handle(
          p2.c_str(),
          0,
          FILE_SHARE_DELETE | FILE_SHARE_READ | FILE_SHARE_WRITE,
          0,
          OPEN_EXISTING,
          FILE_FLAG_BACKUP_SEMANTICS,
          0));

    handle_wrapper h1(
      create_file_handle(
          p1.c_str(),
          0,
          FILE_SHARE_DELETE | FILE_SHARE_READ | FILE_SHARE_WRITE,
          0,
          OPEN_EXISTING,
          FILE_FLAG_BACKUP_SEMANTICS,
          0));

    if (h1.handle == INVALID_HANDLE_VALUE
      || h2.handle == INVALID_HANDLE_VALUE)
    {
      // if one is invalid and the other isn't, then they aren't equivalent,
      // but if both are invalid then it is an error
      error((h1.handle == INVALID_HANDLE_VALUE
        && h2.handle == INVALID_HANDLE_VALUE) ? BOOST_ERROR_NOT_SUPPORTED : 0, p1, p2, ec,
          "boost::filesystem::equivalent");
      return false;
    }

    // at this point, both handles are known to be valid

    BY_HANDLE_FILE_INFORMATION info1, info2;

    if (error(!::GetFileInformationByHandle(h1.handle, &info1) ? BOOST_ERRNO : 0,
      p1, p2, ec, "boost::filesystem::equivalent"))
        return  false;

    if (error(!::GetFileInformationByHandle(h2.handle, &info2) ? BOOST_ERRNO : 0,
      p1, p2, ec, "boost::filesystem::equivalent"))
        return  false;

    // In theory, volume serial numbers are sufficient to distinguish between
    // devices, but in practice VSN's are sometimes duplicated, so last write
    // time and file size are also checked.
      return 
        info1.dwVolumeSerialNumber == info2.dwVolumeSerialNumber
        && info1.nFileIndexHigh == info2.nFileIndexHigh
        && info1.nFileIndexLow == info2.nFileIndexLow
        && info1.nFileSizeHigh == info2.nFileSizeHigh
        && info1.nFileSizeLow == info2.nFileSizeLow
        && info1.ftLastWriteTime.dwLowDateTime
          == info2.ftLastWriteTime.dwLowDateTime
        && info1.ftLastWriteTime.dwHighDateTime
          == info2.ftLastWriteTime.dwHighDateTime;

#   endif
  }